

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::on_callback_change(void)

{
  Callback *callback;
  long lVar1;
  
  s_max_out_verbosity = -9;
  for (lVar1 = s_callbacks; lVar1 != DAT_001599c0; lVar1 = lVar1 + 0x50) {
    if (s_max_out_verbosity <= *(int *)(lVar1 + 0x30)) {
      s_max_out_verbosity = *(int *)(lVar1 + 0x30);
    }
  }
  return;
}

Assistant:

static void on_callback_change()
	{
		s_max_out_verbosity = Verbosity_OFF;
		for (const auto& callback : s_callbacks) {
			s_max_out_verbosity = std::max(s_max_out_verbosity, callback.verbosity);
		}
	}